

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O1

wchar_t borg_new_kill(uint r_idx,wchar_t y,wchar_t x)

{
  borg_kill *pbVar1;
  ushort uVar2;
  ushort uVar3;
  borg_grid *pbVar4;
  byte bVar5;
  int iVar6;
  chunk_conflict *c;
  monster_race *pmVar7;
  wchar_t wVar8;
  _Bool _Var9;
  wchar_t wVar10;
  uint32_t uVar11;
  uint uVar12;
  int iVar13;
  loc grid;
  monster *pmVar14;
  char *pcVar15;
  int iVar16;
  int iVar17;
  borg_kill *pbVar18;
  ulong uVar19;
  wchar_t i;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  bool bVar26;
  
  wVar10 = (wchar_t)borg_kills_nxt;
  if (wVar10 < L'\x02') {
    i = L'\xffffffff';
    bVar20 = 1;
  }
  else {
    pbVar18 = borg_kills + 1;
    i = L'\xffffffff';
    uVar24 = 2;
    do {
      wVar8 = (int)uVar24 + L'\xffffffff';
      if (pbVar18->r_idx != 0) {
        wVar8 = i;
      }
      i = wVar8;
      bVar5 = (byte)((uint)i >> 0x18);
      bVar20 = bVar5 >> 7;
      if (L'\xffffffff' < i) break;
      pbVar18 = pbVar18 + 1;
      bVar26 = uVar24 < (ulong)(long)wVar10;
      uVar24 = uVar24 + 1;
      bVar20 = bVar5 >> 7;
    } while (bVar26);
  }
  if (bVar20 == 1 && wVar10 < L'ÿ') {
    borg_kills_nxt = borg_kills_nxt + 1;
    i = wVar10;
  }
  if (i < L'\0') {
    borg_note("# Too many monsters");
    uVar11 = Rand_div((int)borg_kills_nxt - 1);
    i = uVar11 + L'\x02';
    borg_delete_kill(i);
  }
  c = cave;
  grid = (loc)loc(x,y);
  pmVar14 = square_monster(c,grid);
  pbVar18 = borg_kills;
  pmVar7 = r_info;
  if (pmVar14 == (monster *)0x0) {
    i = L'\xffffffff';
  }
  else {
    borg_kills_cnt = borg_kills_cnt + 1;
    pbVar1 = borg_kills + i;
    uVar2 = borg_kills[i].r_idx;
    pbVar4 = borg_grids[y];
    borg_kills[i].r_idx = (uint16_t)r_idx;
    pbVar18[i].pos.x = x;
    pbVar18[i].ox = (uint8_t)x;
    pbVar18[i].pos.y = y;
    pbVar18[i].oy = (uint8_t)y;
    pbVar18[i].m_idx = (int16_t)pmVar14->midx;
    pbVar4[x].kill = (uint8_t)i;
    pbVar18[i].when = borg_t;
    if (borg_morgoth_id == (r_idx & 0xffff)) {
      borg_t_morgoth = borg_t;
    }
    borg_update_kill_new(i);
    borg_update_kill_old(i);
    uVar12 = (uint)pbVar1->r_idx;
    if (pbVar1->r_idx == 0) {
      pcVar15 = "dead monster";
    }
    else if ((int)uVar12 < (int)(z_info->r_max - 1)) {
      pcVar15 = r_info[uVar12].name;
    }
    else {
      pcVar15 = "player ghost";
    }
    pcVar15 = format("# Creating a monster \'%s\' at (%d,%d), HP: %d, Time: %d, Index: %d",pcVar15,
                     (ulong)(uint)(pbVar1->pos).y,(ulong)(uint)(pbVar1->pos).x,
                     (ulong)(uint)(int)pbVar1->power,(ulong)(uint)(int)pbVar1->when,uVar12);
    borg_note(pcVar15);
    borg_danger_wipe = true;
    if ((int)borg_t < borg.need_see_invis + 5) {
      iVar17 = borg.c.y >> 0x1f;
      iVar16 = borg.c.y / 0xb + iVar17;
      iVar13 = iVar16 - iVar17;
      iVar6 = borg.c.x >> 0x1f;
      iVar23 = borg.c.x / 0xb + iVar6;
      iVar25 = iVar23 - iVar6;
      iVar16 = (iVar16 + -1) - iVar17;
      if (borg.c.y < 0xb) {
        iVar16 = 0;
      }
      iVar17 = (iVar23 + -1) - iVar6;
      if (borg.c.x < 0xb) {
        iVar17 = 0;
      }
      uVar21 = (iVar23 + 1) - iVar6;
      uVar24 = 5;
      if (borg.c.x < 0x37) {
        uVar24 = (ulong)uVar21;
      }
      uVar22 = 0x11;
      if (borg.c.x < 0xbb) {
        uVar22 = uVar21;
      }
      borg_fear_region[iVar13][iVar25] = 0;
      borg_fear_region[iVar13][iVar17] = 0;
      borg_fear_region[iVar13][(int)uVar22] = 0;
      borg_fear_region[iVar16][iVar25] = 0;
      iVar23 = (int)uVar24;
      borg_fear_region[iVar23][iVar25] = 0;
      borg_fear_region[iVar16][iVar17] = 0;
      borg_fear_region[iVar16][(int)uVar22] = 0;
      borg_fear_region[iVar23][iVar17] = 0;
      borg_fear_region[iVar23][(int)uVar22] = 0;
      uVar3 = pbVar1->r_idx;
      if (uVar3 == 0) {
        pcVar15 = "dead monster";
      }
      else if ((int)(uint)uVar3 < (int)(z_info->r_max - 1)) {
        pcVar15 = r_info[(uint)uVar3].name;
      }
      else {
        pcVar15 = "player ghost";
      }
      pcVar15 = format("# Removing Regional Fear (%d,%d) because of a LOS %s",(ulong)(uint)y,
                       (ulong)(uint)x,pcVar15,uVar24,borg_fear_region,uVar12);
      borg_note(pcVar15);
    }
    if ((borg.trait[0x1a] != 0) &&
       (_Var9 = borg_los((pbVar1->pos).y,(pbVar1->pos).x,borg.c.y,borg.c.x), _Var9)) {
      borg.goal.type = 0;
    }
    pbVar4 = pbVar4 + x;
    _Var9 = flag_has_dbg(pmVar7[uVar2].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
    if (!_Var9) {
      pbVar4->feat = '\x01';
    }
    _Var9 = flag_has_dbg(pmVar7[uVar2].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
    if (_Var9) {
      pbVar4->feat = '\x15';
    }
    pmVar7 = r_info;
    uVar24 = (ulong)borg_nasties_num;
    if (uVar24 != 0) {
      uVar19 = 0;
      do {
        if (pmVar7[pbVar1->r_idx].d_char == (int)borg_nasties[uVar19]) {
          borg_nasties_count[uVar19] = borg_nasties_count[uVar19] + '\x01';
        }
        uVar19 = uVar19 + 1;
      } while (uVar24 != uVar19);
    }
  }
  return i;
}

Assistant:

static int borg_new_kill(unsigned int r_idx, int y, int x)
{
    int i, n = -1;

    borg_kill           *kill;
    borg_grid           *ag;
    struct monster_race *r_ptr;
    struct monster      *m_ptr;

    /* Look for a "dead" monster */
    for (i = 1; (n < 0) && (i < borg_kills_nxt); i++) {
        /* Skip real entries */
        if (!borg_kills[i].r_idx)
            n = i;
    }

    /* Allocate a new monster */
    if ((n < 0) && (borg_kills_nxt < 255)) {
        /* Acquire the entry, advance */
        n = borg_kills_nxt++;
    }

    /* Hack -- steal an old monster */
    if (n < 0) {
        /* Note */
        borg_note("# Too many monsters");

        /* Hack -- Pick a random monster */
        n = randint1(borg_kills_nxt - 1) + 1;

        /* Kill it */
        borg_delete_kill(n);
    }

    /* it might be that it can't be found */
    m_ptr = square_monster(cave, loc(x, y));
    if (!m_ptr)
        return -1;

    /* Count the monsters */
    borg_kills_cnt++;

    /* Access the monster */
    kill  = &borg_kills[n];
    r_ptr = &r_info[kill->r_idx];
    ag    = &borg_grids[y][x];

    /* Save the race */
    kill->r_idx = r_idx;

    /* Location */
    kill->ox = kill->pos.x = x;
    kill->oy = kill->pos.y = y;

    /* Games Index of the monster */
    kill->m_idx = m_ptr->midx;

    /* Update the grids */
    borg_grids[kill->pos.y][kill->pos.x].kill = n;

    /* Timestamp */
    kill->when = borg_t;

    /* Mark the Morgoth time stamp if needed */
    if (kill->r_idx == borg_morgoth_id)
        borg_t_morgoth = borg_t;

    /* Update the monster */
    borg_update_kill_new(n);

    /* Update the monster */
    borg_update_kill_old(n);

    /* Note (r_info[kill->r_idx].name)*/
    borg_note(format(
        "# Creating a monster '%s' at (%d,%d), HP: %d, Time: %d, Index: %d",
        borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x, kill->power,
        kill->when, kill->r_idx));

    /* Recalculate danger */
    borg_danger_wipe = true;

    /* Remove Regional Fear which may have been induced from a non-LOS monster.
     * We assume this newly created monster is the one which induced our
     * Regional Fear.  If it wasn't, then the borg will create new Regional Fear
     * next time the unseen monster attacks.  There is no harm done by clearing
     * these. At most, he may end up resting in an area for 1 turn */
    if (borg_t < borg.need_see_invis + 5) {
        int y0, x0, y1, x1, y2, x2;

        y0 = (borg.c.y / 11);
        x0 = (borg.c.x / 11);

        /* Nearby regions */
        y1 = (y0 > 0) ? (y0 - 1) : 0;
        x1 = (x0 > 0) ? (x0 - 1) : 0;
        y2 = (x0 < 5) ? (x0 + 1) : 5;
        x2 = (x0 < 17) ? (x0 + 1) : 17;

        /* Remove "fear", spread around */
        borg_fear_region[y0][x0] = 0;
        borg_fear_region[y0][x1] = 0;
        borg_fear_region[y0][x2] = 0;
        borg_fear_region[y1][x0] = 0;
        borg_fear_region[y2][x0] = 0;
        borg_fear_region[y1][x1] = 0;
        borg_fear_region[y1][x2] = 0;
        borg_fear_region[y2][x1] = 0;
        borg_fear_region[y2][x2] = 0;
        borg_note(format("# Removing Regional Fear (%d,%d) because of a LOS %s",
            y, x, borg_race_name(kill->r_idx)));
    }

    /* Wipe goals only if I have some light source */
    if (borg.trait[BI_LIGHT]
        && borg_los(kill->pos.y, kill->pos.x, borg.c.y, borg.c.x))
        borg.goal.type = 0;

    /* Hack -- Force the monster to be sitting on a floor
     * grid unless that monster can pass through walls
     */
    if (!(rf_has(r_ptr->flags, RF_PASS_WALL))) {
        ag->feat = FEAT_FLOOR;
    }

    /* Hack -- Force the ghostly monster to be in a wall
     * grid until the grid is proven to be something else
     */
    if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
        ag->feat = FEAT_GRANITE;
    }

    /* Count up out list of Nasties */
    for (i = 0; i < borg_nasties_num; i++) {
        /* Count them up */
        if (r_info[kill->r_idx].d_char == borg_nasties[i])
            borg_nasties_count[i]++;
    }

    /* Return the monster */
    return n;
}